

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.cpp
# Opt level: O0

bool chip8::instructions::ld_reg_k(registers *regs,instr_t instr)

{
  keyboard_state this;
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  unsigned_long __n;
  reference pvVar4;
  ulong local_30;
  size_t idx;
  _Base_bitset<1UL> _Stack_20;
  byte pressed_idx;
  keyboard_state kbd_state;
  registers *regs_local;
  instr_t instr_local;
  
  kbd_state.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)regs;
  regs_local._5_2_ = instr._M_elems;
  _Stack_20._M_w = (_WordT)get_keyboard_state();
  sVar2 = std::bitset<16UL>::count((bitset<16UL> *)&stack0xffffffffffffffe0);
  if (sVar2 == 0) {
    regs_local._7_1_ = false;
  }
  else {
    idx._7_1_ = 0;
    local_30 = 0;
    while( true ) {
      sVar2 = std::bitset<16UL>::size((bitset<16UL> *)&stack0xffffffffffffffe0);
      if (sVar2 <= local_30) break;
      bVar1 = std::bitset<16UL>::operator[]((bitset<16UL> *)&stack0xffffffffffffffe0,local_30);
      if (bVar1) {
        idx._7_1_ = (value_type)local_30;
        break;
      }
      local_30 = local_30 + 1;
    }
    this.super__Base_bitset<1UL>._M_w = kbd_state.super__Base_bitset<1UL>._M_w;
    pvVar3 = std::array<std::byte,_2UL>::operator[]
                       ((array<std::byte,_2UL> *)((long)&regs_local + 5),0);
    __n = get_lower_nibble<unsigned_long>(*pvVar3);
    pvVar4 = std::array<std::byte,_16UL>::operator[]
                       ((array<std::byte,_16UL> *)this.super__Base_bitset<1UL>._M_w,__n);
    *pvVar4 = idx._7_1_;
    regs_local._7_1_ = true;
  }
  return regs_local._7_1_;
}

Assistant:

bool instructions::ld_reg_k(chip8::registers& regs, instr_t instr) noexcept
{
	const auto kbd_state = chip8::get_keyboard_state();
	if (!kbd_state.count())
		return false;

	auto pressed_idx = std::byte{0};
	for (size_t idx = 0; idx < kbd_state.size(); ++idx)
	{
		if (kbd_state[idx])
		{
			pressed_idx = std::byte(idx);
			break;
		}
	}

	regs.v[instructions::get_lower_nibble<size_t>(instr[0])] = pressed_idx;
	return true;
}